

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::removeUnits(Model *this,size_t index)

{
  ModelImpl *pMVar1;
  size_type sVar2;
  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  UnitsImpl *this_02;
  const_iterator local_38;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  result;
  bool status;
  size_t index_local;
  Model *this_local;
  
  result._M_current._7_1_ = 0;
  pMVar1 = pFunc(this);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::size(&pMVar1->mUnits);
  if (index < sVar2) {
    pMVar1 = pFunc(this);
    local_30._M_current =
         (shared_ptr<libcellml::Units> *)
         std::
         vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         ::begin(&pMVar1->mUnits);
    local_28 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
               ::operator+(&local_30,index);
    this_00 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
              ::operator*(&local_28);
    this_01 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    this_02 = Units::pFunc(this_01);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_02);
    pMVar1 = pFunc(this);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Units>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
                *)&local_38,&local_28);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    erase(&pMVar1->mUnits,local_38);
    result._M_current._7_1_ = 1;
  }
  return (bool)(result._M_current._7_1_ & 1);
}

Assistant:

bool Model::removeUnits(size_t index)
{
    bool status = false;
    if (index < pFunc()->mUnits.size()) {
        auto result = pFunc()->mUnits.begin() + ptrdiff_t(index);
        (*result)->pFunc()->removeParent();
        pFunc()->mUnits.erase(result);
        status = true;
    }

    return status;
}